

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O1

void __thiscall
cmGraphVizWriter::ReadSettings
          (cmGraphVizWriter *this,string *settingsFileName,string *fallbackSettingsFileName)

{
  pointer pcVar1;
  bool bVar2;
  ostream *poVar3;
  cmValue cVar4;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  char *extraout_RDX_05;
  char *extraout_RDX_06;
  char *extraout_RDX_07;
  char *extraout_RDX_08;
  char *extraout_RDX_09;
  char *extraout_RDX_10;
  char *extraout_RDX_11;
  char *extraout_RDX_12;
  char *extraout_RDX_13;
  char *extraout_RDX_14;
  char *extraout_RDX_15;
  char *extraout_RDX_16;
  char *extraout_RDX_17;
  char *extraout_RDX_18;
  char *extraout_RDX_19;
  char *extraout_RDX_20;
  char *pcVar5;
  pointer pbVar6;
  PositionType PVar7;
  string asVar8 [8];
  string_view value;
  string_view value_00;
  string_view value_01;
  string_view value_02;
  string_view value_03;
  string_view value_04;
  string_view value_05;
  string_view value_06;
  string_view value_07;
  string_view value_08;
  string_view value_09;
  string_view arg;
  RegularExpression currentRegex;
  unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> lg;
  string inFileName;
  string ignoreTargetsRegexes;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ignoreTargetsRegExVector;
  cmMakefile mf;
  cmake cm;
  cmGlobalGenerator ggi;
  undefined1 local_18c8 [16];
  undefined1 local_18b8 [160];
  char *local_1818;
  __node_base_ptr local_1808;
  int local_1800;
  undefined1 local_17f8 [8];
  string local_17f0;
  string local_17d0 [8];
  __buckets_ptr local_17c8;
  undefined1 local_17c0 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_17b0;
  undefined1 local_1798 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1788 [127];
  cmake local_f98;
  
  cmake::cmake(&local_f98,RoleScript,Unknown,Normal);
  local_1798._0_8_ = local_1788;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1798,"");
  cmake::SetHomeDirectory(&local_f98,(string *)local_1798);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1798._0_8_ != local_1788) {
    operator_delete((void *)local_1798._0_8_,local_1788[0]._M_allocated_capacity + 1);
  }
  local_1798._0_8_ = local_1788;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1798,"");
  cmake::SetHomeOutputDirectory(&local_f98,(string *)local_1798);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1798._0_8_ != local_1788) {
    operator_delete((void *)local_1798._0_8_,local_1788[0]._M_allocated_capacity + 1);
  }
  local_1788[0]._M_allocated_capacity = local_f98.CurrentSnapshot.Position.Position;
  local_1798._0_8_ = local_f98.CurrentSnapshot.State;
  local_1798._8_8_ = local_f98.CurrentSnapshot.Position.Tree;
  cmStateSnapshot::SetDefaultDefinitions((cmStateSnapshot *)local_1798);
  cmGlobalGenerator::cmGlobalGenerator((cmGlobalGenerator *)&stack0xfffffffffffff8e0,&local_f98);
  local_18b8._0_8_ = local_f98.CurrentSnapshot.Position.Position;
  local_18c8._0_8_ = local_f98.CurrentSnapshot.State;
  local_18c8._8_8_ = local_f98.CurrentSnapshot.Position.Tree;
  cmMakefile::cmMakefile
            ((cmMakefile *)local_1798,(cmGlobalGenerator *)&stack0xfffffffffffff8e0,
             (cmStateSnapshot *)local_18c8);
  cmGlobalGenerator::CreateLocalGenerator
            ((cmGlobalGenerator *)local_17f8,(cmMakefile *)&stack0xfffffffffffff8e0);
  local_17f0._M_dataplus._M_p = (pointer)&local_17f0.field_2;
  pcVar1 = (settingsFileName->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_17f8 + 8),pcVar1,pcVar1 + settingsFileName->_M_string_length);
  bVar2 = cmsys::SystemTools::FileExists((string *)(local_17f8 + 8));
  if (!bVar2) {
    std::__cxx11::string::_M_assign((string *)(local_17f8 + 8));
    bVar2 = cmsys::SystemTools::FileExists((string *)(local_17f8 + 8));
    if (!bVar2) goto LAB_0042ba4a;
  }
  bVar2 = cmMakefile::ReadListFile((cmMakefile *)local_1798,(string *)(local_17f8 + 8));
  if (bVar2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Reading GraphViz options file: ",0x1f);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_17f0._M_dataplus._M_p,
                        local_17f0._M_string_length);
    std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    local_18c8._0_8_ = (cmState *)local_18b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_18c8,"GRAPHVIZ_GRAPH_NAME","");
    cVar4 = cmMakefile::GetDefinition((cmMakefile *)local_1798,(string *)local_18c8);
    if ((cmState *)local_18c8._0_8_ != (cmState *)local_18b8) {
      operator_delete((void *)local_18c8._0_8_,local_18b8._0_8_ + 1);
    }
    if (cVar4.Value != (string *)0x0) {
      std::__cxx11::string::_M_assign((string *)&this->GraphName);
    }
    local_18c8._0_8_ = (cmState *)local_18b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_18c8,"GRAPHVIZ_GRAPH_HEADER","")
    ;
    cVar4 = cmMakefile::GetDefinition((cmMakefile *)local_1798,(string *)local_18c8);
    if ((cmState *)local_18c8._0_8_ != (cmState *)local_18b8) {
      operator_delete((void *)local_18c8._0_8_,local_18b8._0_8_ + 1);
    }
    if (cVar4.Value != (string *)0x0) {
      std::__cxx11::string::_M_assign((string *)&this->GraphHeader);
    }
    local_18c8._0_8_ = (cmState *)local_18b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_18c8,"GRAPHVIZ_NODE_PREFIX","");
    cVar4 = cmMakefile::GetDefinition((cmMakefile *)local_1798,(string *)local_18c8);
    if ((cmState *)local_18c8._0_8_ != (cmState *)local_18b8) {
      operator_delete((void *)local_18c8._0_8_,local_18b8._0_8_ + 1);
    }
    if (cVar4.Value != (string *)0x0) {
      std::__cxx11::string::_M_assign((string *)&this->GraphNodePrefix);
    }
    local_18c8._0_8_ = (cmState *)local_18b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_18c8,"GRAPHVIZ_EXECUTABLES","");
    cVar4 = cmMakefile::GetDefinition((cmMakefile *)local_1798,(string *)local_18c8);
    pcVar5 = extraout_RDX;
    if ((cmState *)local_18c8._0_8_ != (cmState *)local_18b8) {
      operator_delete((void *)local_18c8._0_8_,local_18b8._0_8_ + 1);
      pcVar5 = extraout_RDX_00;
    }
    if (cVar4.Value != (string *)0x0) {
      value._M_str = pcVar5;
      value._M_len = (size_t)((cVar4.Value)->_M_dataplus)._M_p;
      bVar2 = cmValue::IsOn((cmValue *)(cVar4.Value)->_M_string_length,value);
      this->GenerateForExecutables = bVar2;
    }
    local_18c8._0_8_ = (cmState *)local_18b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_18c8,"GRAPHVIZ_STATIC_LIBS","");
    cVar4 = cmMakefile::GetDefinition((cmMakefile *)local_1798,(string *)local_18c8);
    pcVar5 = extraout_RDX_01;
    if ((cmState *)local_18c8._0_8_ != (cmState *)local_18b8) {
      operator_delete((void *)local_18c8._0_8_,local_18b8._0_8_ + 1);
      pcVar5 = extraout_RDX_02;
    }
    if (cVar4.Value != (string *)0x0) {
      value_00._M_str = pcVar5;
      value_00._M_len = (size_t)((cVar4.Value)->_M_dataplus)._M_p;
      bVar2 = cmValue::IsOn((cmValue *)(cVar4.Value)->_M_string_length,value_00);
      this->GenerateForStaticLibs = bVar2;
    }
    local_18c8._0_8_ = (cmState *)local_18b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_18c8,"GRAPHVIZ_SHARED_LIBS","");
    cVar4 = cmMakefile::GetDefinition((cmMakefile *)local_1798,(string *)local_18c8);
    pcVar5 = extraout_RDX_03;
    if ((cmState *)local_18c8._0_8_ != (cmState *)local_18b8) {
      operator_delete((void *)local_18c8._0_8_,local_18b8._0_8_ + 1);
      pcVar5 = extraout_RDX_04;
    }
    if (cVar4.Value != (string *)0x0) {
      value_01._M_str = pcVar5;
      value_01._M_len = (size_t)((cVar4.Value)->_M_dataplus)._M_p;
      bVar2 = cmValue::IsOn((cmValue *)(cVar4.Value)->_M_string_length,value_01);
      this->GenerateForSharedLibs = bVar2;
    }
    local_18c8._0_8_ = (cmState *)local_18b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_18c8,"GRAPHVIZ_MODULE_LIBS","");
    cVar4 = cmMakefile::GetDefinition((cmMakefile *)local_1798,(string *)local_18c8);
    pcVar5 = extraout_RDX_05;
    if ((cmState *)local_18c8._0_8_ != (cmState *)local_18b8) {
      operator_delete((void *)local_18c8._0_8_,local_18b8._0_8_ + 1);
      pcVar5 = extraout_RDX_06;
    }
    if (cVar4.Value != (string *)0x0) {
      value_02._M_str = pcVar5;
      value_02._M_len = (size_t)((cVar4.Value)->_M_dataplus)._M_p;
      bVar2 = cmValue::IsOn((cmValue *)(cVar4.Value)->_M_string_length,value_02);
      this->GenerateForModuleLibs = bVar2;
    }
    local_18c8._0_8_ = (cmState *)local_18b8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_18c8,"GRAPHVIZ_INTERFACE_LIBS","");
    cVar4 = cmMakefile::GetDefinition((cmMakefile *)local_1798,(string *)local_18c8);
    pcVar5 = extraout_RDX_07;
    if ((cmState *)local_18c8._0_8_ != (cmState *)local_18b8) {
      operator_delete((void *)local_18c8._0_8_,local_18b8._0_8_ + 1);
      pcVar5 = extraout_RDX_08;
    }
    if (cVar4.Value != (string *)0x0) {
      value_03._M_str = pcVar5;
      value_03._M_len = (size_t)((cVar4.Value)->_M_dataplus)._M_p;
      bVar2 = cmValue::IsOn((cmValue *)(cVar4.Value)->_M_string_length,value_03);
      this->GenerateForInterfaceLibs = bVar2;
    }
    local_18c8._0_8_ = (cmState *)local_18b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_18c8,"GRAPHVIZ_OBJECT_LIBS","");
    cVar4 = cmMakefile::GetDefinition((cmMakefile *)local_1798,(string *)local_18c8);
    pcVar5 = extraout_RDX_09;
    if ((cmState *)local_18c8._0_8_ != (cmState *)local_18b8) {
      operator_delete((void *)local_18c8._0_8_,local_18b8._0_8_ + 1);
      pcVar5 = extraout_RDX_10;
    }
    if (cVar4.Value != (string *)0x0) {
      value_04._M_str = pcVar5;
      value_04._M_len = (size_t)((cVar4.Value)->_M_dataplus)._M_p;
      bVar2 = cmValue::IsOn((cmValue *)(cVar4.Value)->_M_string_length,value_04);
      this->GenerateForObjectLibs = bVar2;
    }
    local_18c8._0_8_ = (cmState *)local_18b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_18c8,"GRAPHVIZ_UNKNOWN_LIBS","")
    ;
    cVar4 = cmMakefile::GetDefinition((cmMakefile *)local_1798,(string *)local_18c8);
    pcVar5 = extraout_RDX_11;
    if ((cmState *)local_18c8._0_8_ != (cmState *)local_18b8) {
      operator_delete((void *)local_18c8._0_8_,local_18b8._0_8_ + 1);
      pcVar5 = extraout_RDX_12;
    }
    if (cVar4.Value != (string *)0x0) {
      value_05._M_str = pcVar5;
      value_05._M_len = (size_t)((cVar4.Value)->_M_dataplus)._M_p;
      bVar2 = cmValue::IsOn((cmValue *)(cVar4.Value)->_M_string_length,value_05);
      this->GenerateForUnknownLibs = bVar2;
    }
    local_18c8._0_8_ = (cmState *)local_18b8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_18c8,"GRAPHVIZ_CUSTOM_TARGETS","");
    cVar4 = cmMakefile::GetDefinition((cmMakefile *)local_1798,(string *)local_18c8);
    pcVar5 = extraout_RDX_13;
    if ((cmState *)local_18c8._0_8_ != (cmState *)local_18b8) {
      operator_delete((void *)local_18c8._0_8_,local_18b8._0_8_ + 1);
      pcVar5 = extraout_RDX_14;
    }
    if (cVar4.Value != (string *)0x0) {
      value_06._M_str = pcVar5;
      value_06._M_len = (size_t)((cVar4.Value)->_M_dataplus)._M_p;
      bVar2 = cmValue::IsOn((cmValue *)(cVar4.Value)->_M_string_length,value_06);
      this->GenerateForCustomTargets = bVar2;
    }
    local_18c8._0_8_ = (cmState *)local_18b8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_18c8,"GRAPHVIZ_EXTERNAL_LIBS","");
    cVar4 = cmMakefile::GetDefinition((cmMakefile *)local_1798,(string *)local_18c8);
    pcVar5 = extraout_RDX_15;
    if ((cmState *)local_18c8._0_8_ != (cmState *)local_18b8) {
      operator_delete((void *)local_18c8._0_8_,local_18b8._0_8_ + 1);
      pcVar5 = extraout_RDX_16;
    }
    if (cVar4.Value != (string *)0x0) {
      value_07._M_str = pcVar5;
      value_07._M_len = (size_t)((cVar4.Value)->_M_dataplus)._M_p;
      bVar2 = cmValue::IsOn((cmValue *)(cVar4.Value)->_M_string_length,value_07);
      this->GenerateForExternals = bVar2;
    }
    local_18c8._0_8_ = (cmState *)local_18b8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_18c8,"GRAPHVIZ_GENERATE_PER_TARGET","");
    cVar4 = cmMakefile::GetDefinition((cmMakefile *)local_1798,(string *)local_18c8);
    pcVar5 = extraout_RDX_17;
    if ((cmState *)local_18c8._0_8_ != (cmState *)local_18b8) {
      operator_delete((void *)local_18c8._0_8_,local_18b8._0_8_ + 1);
      pcVar5 = extraout_RDX_18;
    }
    if (cVar4.Value != (string *)0x0) {
      value_08._M_str = pcVar5;
      value_08._M_len = (size_t)((cVar4.Value)->_M_dataplus)._M_p;
      bVar2 = cmValue::IsOn((cmValue *)(cVar4.Value)->_M_string_length,value_08);
      this->GeneratePerTarget = bVar2;
    }
    local_18c8._0_8_ = (cmState *)local_18b8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_18c8,"GRAPHVIZ_GENERATE_DEPENDERS","");
    cVar4 = cmMakefile::GetDefinition((cmMakefile *)local_1798,(string *)local_18c8);
    pcVar5 = extraout_RDX_19;
    if ((cmState *)local_18c8._0_8_ != (cmState *)local_18b8) {
      operator_delete((void *)local_18c8._0_8_,local_18b8._0_8_ + 1);
      pcVar5 = extraout_RDX_20;
    }
    if (cVar4.Value != (string *)0x0) {
      value_09._M_str = pcVar5;
      value_09._M_len = (size_t)((cVar4.Value)->_M_dataplus)._M_p;
      bVar2 = cmValue::IsOn((cmValue *)(cVar4.Value)->_M_string_length,value_09);
      this->GenerateDependers = bVar2;
    }
    local_17d0 = (string  [8])local_17c0;
    local_17c8 = (__buckets_ptr)0x0;
    local_17c0[0] = 0;
    local_18c8._0_8_ = (cmState *)local_18b8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_18c8,"GRAPHVIZ_IGNORE_TARGETS","");
    cVar4 = cmMakefile::GetDefinition((cmMakefile *)local_1798,(string *)local_18c8);
    if ((cmState *)local_18c8._0_8_ != (cmState *)local_18b8) {
      operator_delete((void *)local_18c8._0_8_,local_18b8._0_8_ + 1);
    }
    if (cVar4.Value != (string *)0x0) {
      std::__cxx11::string::_M_assign(local_17d0);
    }
    std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::clear
              (&this->TargetsToIgnoreRegex);
    if (local_17c8 != (__buckets_ptr)0x0) {
      arg._M_str = (char *)local_17d0;
      arg._M_len = (size_t)local_17c8;
      cmExpandedList_abi_cxx11_(&local_17b0,arg,false);
      for (pbVar6 = local_17b0.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pbVar6 != local_17b0.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          pbVar6 = (pointer)((long)pbVar6 + 0x20)) {
        local_1818 = (char *)0x0;
        local_1808 = (__node_base_ptr)0x0;
        local_1800 = 0;
        memset(local_18c8,0,0xaa);
        bVar2 = cmsys::RegularExpression::compile((RegularExpression *)local_18c8,*(char **)pbVar6);
        if (!bVar2) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Could not compile bad regex \"",0x1d);
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,*(char **)pbVar6,*(long *)((long)pbVar6 + 8));
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\"",1);
          std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
          std::ostream::put((char)poVar3);
          std::ostream::flush();
        }
        std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::
        emplace_back<cmsys::RegularExpression>
                  (&this->TargetsToIgnoreRegex,(RegularExpression *)local_18c8);
        if (local_1808 != (__node_base_ptr)0x0) {
          operator_delete__(local_1808);
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_17b0);
    }
    if (local_17d0 == (string  [8])local_17c0) goto LAB_0042ba4a;
    PVar7 = CONCAT71(local_17c0._1_7_,local_17c0[0]);
    asVar8 = local_17d0;
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_18c8,
                   "Problem opening GraphViz options file: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_17f8 + 8));
    cmSystemTools::Error((string *)local_18c8);
    PVar7 = local_18b8._0_8_;
    asVar8 = (string  [8])local_18c8._0_8_;
    if ((cmState *)local_18c8._0_8_ == (cmState *)local_18b8) goto LAB_0042ba4a;
  }
  operator_delete((void *)asVar8,PVar7 + 1);
LAB_0042ba4a:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_17f0._M_dataplus._M_p != &local_17f0.field_2) {
    operator_delete(local_17f0._M_dataplus._M_p,local_17f0.field_2._M_allocated_capacity + 1);
  }
  if (local_17f8 != (undefined1  [8])0x0) {
    (**(code **)(*(_func_int **)local_17f8 + 8))();
  }
  cmMakefile::~cmMakefile((cmMakefile *)local_1798);
  cmGlobalGenerator::~cmGlobalGenerator((cmGlobalGenerator *)&stack0xfffffffffffff8e0);
  cmake::~cmake(&local_f98);
  return;
}

Assistant:

void cmGraphVizWriter::ReadSettings(
  const std::string& settingsFileName,
  const std::string& fallbackSettingsFileName)
{
  cmake cm(cmake::RoleScript, cmState::Unknown);
  cm.SetHomeDirectory("");
  cm.SetHomeOutputDirectory("");
  cm.GetCurrentSnapshot().SetDefaultDefinitions();
  cmGlobalGenerator ggi(&cm);
  cmMakefile mf(&ggi, cm.GetCurrentSnapshot());
  std::unique_ptr<cmLocalGenerator> lg(ggi.CreateLocalGenerator(&mf));

  std::string inFileName = settingsFileName;
  if (!cmSystemTools::FileExists(inFileName)) {
    inFileName = fallbackSettingsFileName;
    if (!cmSystemTools::FileExists(inFileName)) {
      return;
    }
  }

  if (!mf.ReadListFile(inFileName)) {
    cmSystemTools::Error("Problem opening GraphViz options file: " +
                         inFileName);
    return;
  }

  std::cout << "Reading GraphViz options file: " << inFileName << std::endl;

#define set_if_set(var, cmakeDefinition)                                      \
  do {                                                                        \
    cmValue value = mf.GetDefinition(cmakeDefinition);                        \
    if (value) {                                                              \
      (var) = *value;                                                         \
    }                                                                         \
  } while (false)

  set_if_set(this->GraphName, "GRAPHVIZ_GRAPH_NAME");
  set_if_set(this->GraphHeader, "GRAPHVIZ_GRAPH_HEADER");
  set_if_set(this->GraphNodePrefix, "GRAPHVIZ_NODE_PREFIX");

#define set_bool_if_set(var, cmakeDefinition)                                 \
  do {                                                                        \
    cmValue value = mf.GetDefinition(cmakeDefinition);                        \
    if (value) {                                                              \
      (var) = cmIsOn(*value);                                                 \
    }                                                                         \
  } while (false)

  set_bool_if_set(this->GenerateForExecutables, "GRAPHVIZ_EXECUTABLES");
  set_bool_if_set(this->GenerateForStaticLibs, "GRAPHVIZ_STATIC_LIBS");
  set_bool_if_set(this->GenerateForSharedLibs, "GRAPHVIZ_SHARED_LIBS");
  set_bool_if_set(this->GenerateForModuleLibs, "GRAPHVIZ_MODULE_LIBS");
  set_bool_if_set(this->GenerateForInterfaceLibs, "GRAPHVIZ_INTERFACE_LIBS");
  set_bool_if_set(this->GenerateForObjectLibs, "GRAPHVIZ_OBJECT_LIBS");
  set_bool_if_set(this->GenerateForUnknownLibs, "GRAPHVIZ_UNKNOWN_LIBS");
  set_bool_if_set(this->GenerateForCustomTargets, "GRAPHVIZ_CUSTOM_TARGETS");
  set_bool_if_set(this->GenerateForExternals, "GRAPHVIZ_EXTERNAL_LIBS");
  set_bool_if_set(this->GeneratePerTarget, "GRAPHVIZ_GENERATE_PER_TARGET");
  set_bool_if_set(this->GenerateDependers, "GRAPHVIZ_GENERATE_DEPENDERS");

  std::string ignoreTargetsRegexes;
  set_if_set(ignoreTargetsRegexes, "GRAPHVIZ_IGNORE_TARGETS");

  this->TargetsToIgnoreRegex.clear();
  if (!ignoreTargetsRegexes.empty()) {
    std::vector<std::string> ignoreTargetsRegExVector =
      cmExpandedList(ignoreTargetsRegexes);
    for (std::string const& currentRegexString : ignoreTargetsRegExVector) {
      cmsys::RegularExpression currentRegex;
      if (!currentRegex.compile(currentRegexString)) {
        std::cerr << "Could not compile bad regex \"" << currentRegexString
                  << "\"" << std::endl;
      }
      this->TargetsToIgnoreRegex.push_back(std::move(currentRegex));
    }
  }
}